

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

PropertyIndex __thiscall
Js::DictionaryTypeHandlerBase<int>::GetPropertyIndex
          (DictionaryTypeHandlerBase<int> *this,PropertyRecord *propertyRecord)

{
  PropertyIndex PVar1;
  
  PVar1 = GetPropertyIndex_Internal<false>(this,propertyRecord);
  return PVar1;
}

Assistant:

PropertyIndex DictionaryTypeHandlerBase<T>::GetPropertyIndex(PropertyRecord const* propertyRecord)
    {
        return GetPropertyIndex_Internal<false>(propertyRecord);
    }